

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O3

void __thiscall fineftp::FtpSession::startSendingMessages(FtpSession *this)

{
  _Elt_pointer pbVar1;
  ostream *poVar2;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  error_code local_80;
  write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_asio::detail::is_continuation_if_running>_>
  local_70;
  
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"FTP >> ",7);
  pbVar1 = (this->command_output_queue_).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&::std::cout,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  ::std::ostream::put((char)poVar2);
  ::std::ostream::flush();
  pbVar1 = (this->command_output_queue_).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_70.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.super_const_buffer.
  size_ = pbVar1->_M_string_length;
  local_70.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.super_const_buffer.
  data_ = (void *)local_70.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
                  super_const_buffer.size_;
  if ((pointer)local_70.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
               super_const_buffer.size_ != (pointer)0x0) {
    local_70.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
    super_const_buffer.data_ = (pbVar1->_M_dataplus)._M_p;
  }
  ::std::__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fineftp::FtpSession,void>
            ((__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2> *)&local_98,
             (__weak_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_70.handler_.handler_.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_90;
  local_70.handler_.handler_.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_98;
  local_70.handler_.dispatcher_.service_ = (this->command_write_strand_).service_;
  local_70.handler_.dispatcher_.impl_ = (this->command_write_strand_).impl_;
  local_70.stream_ = &this->command_socket_;
  local_98 = (element_type *)0x0;
  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.total_consumed_ = 0;
  local_70.start_ = 0;
  local_80._M_value = 0;
  local_80._M_cat = (error_category *)::std::_V2::system_category();
  asio::detail::
  write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:90:23),_asio::detail::is_continuation_if_running>_>
  ::operator()(&local_70,&local_80,0,1);
  if (local_70.handler_.handler_.me.
      super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_70.handler_.handler_.me.
               super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
  }
  return;
}

Assistant:

void FtpSession::startSendingMessages()
  {
#ifndef NDEBUG
    std::cout << "FTP >> " << command_output_queue_.front() << std::endl;
#endif

    asio::async_write(command_socket_
                    , asio::buffer(command_output_queue_.front())
                    , command_write_strand_.wrap(
                      [me = shared_from_this()](asio::error_code ec, std::size_t /*bytes_to_transfer*/)
                      {
                        if (!ec)
                        {
                          me->command_output_queue_.pop_front();
              
                          if (!me->command_output_queue_.empty())
                          {
                            me->startSendingMessages();
                          }
                        }
                        else
                        {
                          std::cerr << "Command write error: " << ec.message() << std::endl;
                        }
                      }
                    ));
  }